

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::Load<wabt::interp::Simd<signed_char,(unsigned_char)8>>
          (Memory *this,u64 offset,u64 addend,Simd<signed_char,_(unsigned_char)__b_> *out)

{
  bool bVar1;
  uchar *src;
  size_type ssize;
  Simd<signed_char,_(unsigned_char)__b_> *out_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  bVar1 = IsValidAccess(this,offset,addend,8);
  if (bVar1) {
    src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    ssize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    MemcpyEndianAware(out,src,8,ssize,0,offset + addend,8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::Load(u64 offset, u64 addend, T* out) const {
  if (!IsValidAccess(offset, addend, sizeof(T))) {
    return Result::Error;
  }
  MemcpyEndianAware(out, data_.data(), sizeof(T), data_.size(), 0,
                    offset + addend, sizeof(T));
  return Result::Ok;
}